

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_strauss_point_state *psVar1;
  secp256k1_strauss_point_state *psVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint64_t uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined1 *puVar12;
  secp256k1_gej *psVar13;
  bool bVar14;
  undefined1 *puVar15;
  secp256k1_gej *psVar16;
  uint uVar17;
  secp256k1_scalar *a_00;
  secp256k1_scalar *a_01;
  secp256k1_scalar *a_02;
  secp256k1_scalar *a_03;
  ulong extraout_RDX;
  secp256k1_ge *a_04;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *extraout_RDX_02;
  secp256k1_modinv64_modinfo *modinfo;
  secp256k1_gej *extraout_RDX_03;
  code *extraout_RDX_04;
  secp256k1_gej *psVar21;
  long lVar22;
  secp256k1_modinv64_modinfo *psVar23;
  undefined8 *puVar24;
  secp256k1_gej *psVar25;
  ulong uVar26;
  ulong uVar27;
  undefined8 *puVar28;
  secp256k1_gej *r_00;
  uint64_t *puVar29;
  long lVar30;
  secp256k1_gej *psVar31;
  secp256k1_gej *psVar32;
  uint uVar33;
  long lVar34;
  secp256k1_gej *psVar35;
  secp256k1_gej *psVar36;
  secp256k1_gej *psVar37;
  secp256k1_gej *psVar38;
  secp256k1_gej *psVar39;
  secp256k1_gej *psVar40;
  byte bVar41;
  secp256k1_scalar na_lam;
  secp256k1_scalar ng_128;
  secp256k1_scalar ng_1;
  secp256k1_fe Z;
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_scalar sStack_1274;
  secp256k1_strauss_state sStack_1270;
  secp256k1_gej sStack_1258;
  secp256k1_gej sStack_11c0;
  secp256k1_fe asStack_1128 [4];
  secp256k1_ge sStack_1060;
  secp256k1_ge asStack_ff8 [4];
  secp256k1_strauss_point_state sStack_e58;
  secp256k1_gej *psStack_a40;
  secp256k1_gej *psStack_a38;
  secp256k1_gej *psStack_a30;
  secp256k1_gej *psStack_a28;
  secp256k1_gej *psStack_a20;
  secp256k1_gej *psStack_a18;
  int iStack_a0c;
  secp256k1_gej *psStack_a08;
  uint64_t uStack_a00;
  uint64_t uStack_9f8;
  uint64_t uStack_9f0;
  secp256k1_gej *psStack_9e8;
  secp256k1_gej *psStack_9e0;
  secp256k1_gej *psStack_9d8;
  secp256k1_gej *psStack_9d0;
  secp256k1_gej *psStack_9c8;
  secp256k1_gej *psStack_9c0;
  uint uStack_9ac;
  secp256k1_gej *psStack_9a8;
  secp256k1_gej *psStack_9a0;
  long lStack_998;
  ulong uStack_990;
  ulong uStack_988;
  secp256k1_gej *psStack_980;
  undefined1 auStack_978 [56];
  uint64_t uStack_940;
  uint64_t uStack_938;
  uint64_t uStack_930;
  ulong auStack_928 [2];
  undefined1 auStack_918 [56];
  secp256k1_gej *psStack_8e0;
  secp256k1_gej *psStack_8d8;
  secp256k1_gej *psStack_8d0;
  undefined1 auStack_8c8 [48];
  uint64_t uStack_898;
  uint64_t uStack_890;
  uint64_t uStack_888;
  uint64_t uStack_880;
  undefined1 auStack_878 [96];
  secp256k1_gej *psStack_818;
  ulong uStack_810;
  secp256k1_gej *psStack_808;
  secp256k1_gej *psStack_800;
  secp256k1_gej *psStack_7f8;
  secp256k1_gej *psStack_7f0;
  secp256k1_gej *psStack_7e8;
  secp256k1_gej *psStack_7e0;
  secp256k1_gej *psStack_7d8;
  secp256k1_fe *psStack_7d0;
  secp256k1_gej *psStack_7c8;
  undefined1 auStack_7c0 [56];
  uint64_t uStack_788;
  uint64_t uStack_780;
  uint64_t uStack_778;
  uint64_t uStack_770;
  int iStack_768;
  undefined1 auStack_760 [56];
  secp256k1_gej *psStack_728;
  secp256k1_gej *psStack_720;
  secp256k1_gej *psStack_718;
  secp256k1_gej *psStack_710;
  ulong uStack_708;
  undefined1 auStack_700 [56];
  secp256k1_gej *psStack_6c8;
  secp256k1_gej *psStack_6c0;
  secp256k1_gej *psStack_6b8;
  ulong uStack_6b0;
  ulong uStack_6a8;
  secp256k1_fe sStack_6a0;
  secp256k1_fe sStack_670;
  secp256k1_fe sStack_640;
  secp256k1_fe sStack_610;
  undefined1 auStack_5e0 [96];
  secp256k1_gej *psStack_580;
  secp256k1_gej *psStack_570;
  secp256k1_gej *psStack_568;
  secp256k1_gej *psStack_560;
  secp256k1_gej *psStack_558;
  secp256k1_scalar *psStack_550;
  secp256k1_gej *psStack_548;
  secp256k1_gej *psStack_540;
  secp256k1_gej *psStack_538;
  secp256k1_gej *psStack_530;
  char local_521;
  secp256k1_gej *local_520;
  secp256k1_gej *local_518;
  secp256k1_gej *local_510;
  secp256k1_gej *local_508;
  secp256k1_gej *local_500;
  long local_4f8;
  long local_4f0;
  undefined1 local_4e8 [112];
  undefined1 local_478 [24];
  undefined1 local_460 [16];
  undefined8 local_450;
  secp256k1_scalar local_448 [132];
  secp256k1_gej local_238 [3];
  
  bVar41 = 0;
  local_478._0_8_ = 1;
  local_478._8_16_ = (undefined1  [16])0x0;
  local_460 = (undefined1  [16])0x0;
  local_450._0_4_ = 1;
  local_450._4_4_ = 1;
  psStack_530 = (secp256k1_gej *)0x11cfbd;
  psVar36 = a;
  psVar37 = (secp256k1_gej *)na;
  local_508 = (secp256k1_gej *)ng;
  local_500 = r;
  secp256k1_fe_verify((secp256k1_fe *)local_478);
  local_521 = '\x01';
  if (num == 0) {
    local_520 = (secp256k1_gej *)0x0;
  }
  else {
    psVar35 = (secp256k1_gej *)0x0;
    local_520 = (secp256k1_gej *)0x0;
    do {
      psVar25 = local_238;
      psStack_530 = (secp256k1_gej *)0x11cfe7;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*na);
      if (*na != 0) {
        psStack_530 = (secp256k1_gej *)0x11cffa;
        secp256k1_gej_verify(a);
        iVar9 = (int)psVar36;
        if (a->infinity == 0) {
          psStack_530 = (secp256k1_gej *)0x11d01d;
          secp256k1_scalar_split_lambda(local_448,(secp256k1_scalar *)local_4e8,na);
          psVar21 = (secp256k1_gej *)((long)psVar35 * 0x410);
          psStack_530 = (secp256k1_gej *)0x11d03d;
          local_510 = psVar35;
          iVar9 = secp256k1_ecmult_wnaf
                            (state->ps[(long)psVar35].wnaf_na_1,(int)local_448,a_00,iVar9);
          psVar1 = state->ps;
          psVar2 = psVar1 + (long)psVar35;
          psVar13 = (secp256k1_gej *)psVar2->wnaf_na_lam;
          psVar2->bits_na_1 = iVar9;
          psVar38 = (secp256k1_gej *)local_4e8;
          psStack_530 = (secp256k1_gej *)0x11d05c;
          uVar10 = secp256k1_ecmult_wnaf((int *)psVar13,(int)psVar38,a_01,(int)psVar1);
          psVar2 = state->ps;
          psVar2[(long)psVar35].bits_na_lam = uVar10;
          uVar17 = psVar2[(long)psVar35].bits_na_1;
          psVar36 = (secp256k1_gej *)(ulong)uVar17;
          if (0x81 < (int)uVar17) goto LAB_0011d63e;
          if (0x81 < (int)uVar10) goto LAB_0011d643;
          if ((int)uVar17 <= (int)local_520) {
            psVar36 = (secp256k1_gej *)((ulong)local_520 & 0xffffffff);
          }
          if ((int)psVar36 < (int)uVar10) {
            psVar36 = (secp256k1_gej *)(ulong)uVar10;
          }
          psStack_530 = (secp256k1_gej *)0x11d0aa;
          local_520 = psVar36;
          memcpy(psVar25,a,0x98);
          psVar35 = local_510;
          if (local_510 != (secp256k1_gej *)0x0) {
            psStack_530 = (secp256k1_gej *)0x11d0ca;
            secp256k1_gej_rescale(psVar25,(secp256k1_fe *)local_478);
          }
          psVar36 = local_238;
          psStack_530 = (secp256k1_gej *)0x11d0f6;
          secp256k1_ecmult_odd_multiples_table
                    ((int)psVar35 * 0x1a0 + (int)state->pre_a,
                     (secp256k1_ge *)(state->aux + (long)psVar35 * 4),(secp256k1_fe *)local_478,
                     &psVar36->x,psVar37);
          if (psVar35 != (secp256k1_gej *)0x0) {
            psStack_530 = (secp256k1_gej *)0x11d11a;
            secp256k1_fe_mul(state->aux + (long)psVar35 * 4,state->aux + (long)psVar35 * 4,&a->z);
          }
          psVar35 = (secp256k1_gej *)((long)(psVar35->x).n + 1);
        }
      }
      a = a + 1;
      na = na + 1;
      num = (size_t)&((secp256k1_gej *)(num + -0x98))->field_0x97;
    } while ((undefined1 *)num != (undefined1 *)0x0);
    if (psVar35 != (secp256k1_gej *)0x0) {
      psStack_530 = (secp256k1_gej *)0x11d155;
      local_521 = psVar35 == (secp256k1_gej *)0x0;
      secp256k1_ge_table_set_globalz((long)psVar35 * 4,state->pre_a,state->aux);
      lVar34 = 0;
      psVar25 = (secp256k1_gej *)0x0;
      psVar37 = (secp256k1_gej *)0x0;
      local_510 = psVar35;
      do {
        lVar22 = 0;
        local_518 = psVar25;
        do {
          psStack_530 = (secp256k1_gej *)0x11d188;
          secp256k1_fe_mul((secp256k1_fe *)((long)state->aux->n + lVar22 + lVar34),
                           (secp256k1_fe *)((long)(state->pre_a->x).n + (long)(psVar25->x).n),
                           &secp256k1_const_beta);
          psVar25 = (secp256k1_gej *)((psVar25->z).n + 1);
          lVar22 = lVar22 + 0x30;
        } while (lVar22 != 0xc0);
        psVar37 = (secp256k1_gej *)((long)(psVar37->x).n + 1);
        psVar25 = (secp256k1_gej *)(local_518[2].z.n + 2);
        lVar34 = lVar34 + 0xc0;
      } while (psVar37 != local_510);
      goto LAB_0011d1c6;
    }
  }
  local_510 = (secp256k1_gej *)0x0;
LAB_0011d1c6:
  psVar37 = local_508;
  if (local_508 == (secp256k1_gej *)0x0) {
    local_4f0 = 0;
    local_4f8 = 0;
    uVar17 = (uint)local_520;
  }
  else {
    psStack_530 = (secp256k1_gej *)0x11d1dd;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)(local_508->x).n[0]);
    local_4e8._108_4_ = (undefined4)(psVar37->x).n[0];
    local_4e8._104_4_ = 0;
    psStack_530 = (secp256k1_gej *)0x11d200;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)local_4e8._108_4_);
    psStack_530 = (secp256k1_gej *)0x11d209;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)local_4e8._104_4_);
    psStack_530 = (secp256k1_gej *)0x11d219;
    uVar10 = secp256k1_ecmult_wnaf((int *)local_238,(int)local_4e8 + 0x6c,a_02,(int)psVar36);
    psStack_530 = (secp256k1_gej *)0x11d22b;
    uVar11 = secp256k1_ecmult_wnaf((int *)local_448,(int)local_4e8 + 0x68,a_03,(int)psVar36);
    uVar17 = (uint)local_520;
    if ((int)(uint)local_520 < (int)uVar10) {
      uVar17 = uVar10;
    }
    if ((int)uVar17 < (int)uVar11) {
      uVar17 = uVar11;
    }
    local_4f8 = (long)(int)uVar11;
    local_4f0 = (long)(int)uVar10;
  }
  psVar13 = local_500;
  psStack_530 = (secp256k1_gej *)0x11d26f;
  secp256k1_gej_set_infinity(local_500);
  if (0 < (int)uVar17) {
    psVar37 = (secp256k1_gej *)(ulong)uVar17;
    local_508 = (secp256k1_gej *)((long)psVar37 * 4 + -4);
    local_520 = (secp256k1_gej *)state;
    do {
      psStack_530 = (secp256k1_gej *)0x11d298;
      secp256k1_gej_double_var(psVar13,psVar13,(secp256k1_fe *)0x0);
      local_518 = psVar37;
      psVar38 = psVar37;
      if (local_521 == '\0') {
        na = (secp256k1_scalar *)0x40c;
        a = (secp256k1_gej *)0x30;
        psVar21 = (secp256k1_gej *)0x0;
        num = (size_t)local_508;
        psVar25 = local_510;
        do {
          psVar36 = (secp256k1_gej *)(((secp256k1_gej *)state)->x).n[2];
          if (((long)psVar38 <= (long)*(int *)(&psVar36[-1].field_0x94 + (long)na)) &&
             (uVar17 = *(uint *)((long)(psVar36->x).n + (long)(((secp256k1_gej *)num)->x).n),
             uVar17 != 0)) {
            if ((uVar17 & 1) == 0) {
              psStack_530 = (secp256k1_gej *)0x11d625;
              secp256k1_ecmult_strauss_wnaf_cold_5();
LAB_0011d625:
              psStack_530 = (secp256k1_gej *)0x11d62a;
              secp256k1_ecmult_strauss_wnaf_cold_8();
LAB_0011d62a:
              psStack_530 = (secp256k1_gej *)0x11d62f;
              secp256k1_ecmult_strauss_wnaf_cold_4();
LAB_0011d62f:
              psStack_530 = (secp256k1_gej *)0x11d634;
              secp256k1_ecmult_strauss_wnaf_cold_7();
            }
            else {
              if ((int)uVar17 < -7) goto LAB_0011d62a;
              if ((int)uVar17 < 8) {
                uVar3 = (((secp256k1_gej *)state)->x).n[1];
                if ((int)uVar17 < 1) {
                  puVar24 = (undefined8 *)
                            ((long)&a->x + uVar3 + (ulong)(~uVar17 >> 1) * 0x68 + -0x30);
                  puVar28 = (undefined8 *)local_4e8;
                  for (lVar34 = 0xd; lVar34 != 0; lVar34 = lVar34 + -1) {
                    *puVar28 = *puVar24;
                    puVar24 = puVar24 + (ulong)bVar41 * -2 + 1;
                    puVar28 = puVar28 + (ulong)bVar41 * -2 + 1;
                  }
                  psStack_530 = (secp256k1_gej *)0x11d357;
                  secp256k1_fe_verify((secp256k1_fe *)(local_4e8 + 0x30));
                  psStack_530 = (secp256k1_gej *)0x11d368;
                  secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_4e8._88_8_ & 0xffffffff),1);
                  local_4e8._48_8_ = 0x3ffffbfffff0bc - local_4e8._48_8_;
                  local_4e8._56_8_ = 0x3ffffffffffffc - local_4e8._56_8_;
                  local_4e8._64_8_ = 0x3ffffffffffffc - local_4e8._64_8_;
                  local_4e8._72_8_ = 0x3ffffffffffffc - local_4e8._72_8_;
                  local_4e8._80_8_ = 0x3fffffffffffc - local_4e8._80_8_;
                  local_4e8._88_8_ = 2;
                  psStack_530 = (secp256k1_gej *)0x11d3ce;
                  secp256k1_fe_verify((secp256k1_fe *)(local_4e8 + 0x30));
                  state = (secp256k1_strauss_state *)local_520;
                }
                else {
                  puVar24 = (undefined8 *)
                            ((long)&a->x + uVar3 + (ulong)(uVar17 - 1 >> 1) * 0x68 + -0x30);
                  puVar28 = (undefined8 *)local_4e8;
                  for (lVar34 = 0xd; lVar34 != 0; lVar34 = lVar34 + -1) {
                    *puVar28 = *puVar24;
                    puVar24 = puVar24 + (ulong)bVar41 * -2 + 1;
                    puVar28 = puVar28 + (ulong)bVar41 * -2 + 1;
                  }
                }
                psStack_530 = (secp256k1_gej *)0x11d3e8;
                psVar13 = local_500;
                secp256k1_gej_add_ge_var
                          (local_500,local_500,(secp256k1_ge *)local_4e8,(secp256k1_fe *)0x0);
                psVar36 = (secp256k1_gej *)(((secp256k1_gej *)state)->x).n[2];
                psVar38 = local_518;
                goto LAB_0011d3f1;
              }
            }
            psStack_530 = (secp256k1_gej *)0x11d639;
            secp256k1_ecmult_strauss_wnaf_cold_3();
LAB_0011d639:
            psStack_530 = (secp256k1_gej *)0x11d63e;
            secp256k1_ecmult_strauss_wnaf_cold_6();
            goto LAB_0011d63e;
          }
LAB_0011d3f1:
          if (((long)psVar38 <= (long)*(int *)((long)(psVar36->x).n + (long)na)) &&
             (uVar17 = *(uint *)((undefined1 *)((long)psVar36[3].y.n + 0xc) + num), uVar17 != 0)) {
            if ((uVar17 & 1) == 0) goto LAB_0011d625;
            if ((int)uVar17 < -7) goto LAB_0011d62f;
            if ((int)uVar17 < 8) {
              uVar3 = (((secp256k1_gej *)state)->x).n[0];
              uVar4 = (((secp256k1_gej *)state)->x).n[1];
              if ((int)uVar17 < 1) {
                psStack_530 = (secp256k1_gej *)0x11d489;
                secp256k1_ge_set_xy((secp256k1_ge *)local_4e8,
                                    (secp256k1_fe *)((long)(&psVar21->x)[~uVar17 >> 1].n + uVar3),
                                    (secp256k1_fe *)
                                    ((long)&a->x + (ulong)(~uVar17 >> 1) * 0x68 + uVar4));
                psStack_530 = (secp256k1_gej *)0x11d493;
                secp256k1_fe_verify((secp256k1_fe *)(local_4e8 + 0x30));
                psStack_530 = (secp256k1_gej *)0x11d4a4;
                secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_4e8._88_8_ & 0xffffffff),1);
                local_4e8._48_8_ = 0x3ffffbfffff0bc - local_4e8._48_8_;
                local_4e8._56_8_ = 0x3ffffffffffffc - local_4e8._56_8_;
                local_4e8._64_8_ = 0x3ffffffffffffc - local_4e8._64_8_;
                local_4e8._72_8_ = 0x3ffffffffffffc - local_4e8._72_8_;
                local_4e8._80_8_ = 0x3fffffffffffc - local_4e8._80_8_;
                local_4e8._88_8_ = 2;
                psStack_530 = (secp256k1_gej *)0x11d50a;
                secp256k1_fe_verify((secp256k1_fe *)(local_4e8 + 0x30));
              }
              else {
                uVar20 = (ulong)(uVar17 - 1 >> 1);
                psStack_530 = (secp256k1_gej *)0x11d45b;
                secp256k1_ge_set_xy((secp256k1_ge *)local_4e8,
                                    (secp256k1_fe *)((long)(&psVar21->x)[uVar20].n + uVar3),
                                    (secp256k1_fe *)((long)&a->x + uVar20 * 0x68 + uVar4));
              }
              psVar36 = (secp256k1_gej *)0x0;
              psStack_530 = (secp256k1_gej *)0x11d51c;
              psVar13 = local_500;
              secp256k1_gej_add_ge_var
                        (local_500,local_500,(secp256k1_ge *)local_4e8,(secp256k1_fe *)0x0);
              psVar38 = local_518;
              state = (secp256k1_strauss_state *)local_520;
              goto LAB_0011d526;
            }
            goto LAB_0011d639;
          }
LAB_0011d526:
          num = (size_t)((((secp256k1_gej *)(num + 0x390))->z).n + 4);
          na = na + 0x104;
          a = (secp256k1_gej *)(a[2].z.n + 2);
          psVar21 = (secp256k1_gej *)&psVar21[1].x.magnitude;
          psVar25 = (secp256k1_gej *)&psVar25[-1].field_0x97;
        } while (psVar25 != (secp256k1_gej *)0x0);
      }
      psVar13 = local_500;
      psVar37 = (secp256k1_gej *)&psVar38[-1].field_0x97;
      if (((long)psVar38 <= local_4f0) &&
         (iVar9 = *(int *)((long)local_238[0].x.n + (long)psVar37 * 4), iVar9 != 0)) {
        psStack_530 = (secp256k1_gej *)0x11d577;
        secp256k1_ecmult_table_get_ge_storage
                  ((secp256k1_ge *)local_4e8,secp256k1_pre_g,iVar9,(int)psVar36);
        state = (secp256k1_strauss_state *)local_520;
        psVar36 = (secp256k1_gej *)local_478;
        psStack_530 = (secp256k1_gej *)0x11d592;
        secp256k1_gej_add_zinv_var
                  (psVar13,psVar13,(secp256k1_ge *)local_4e8,(secp256k1_fe *)psVar36);
        psVar38 = local_518;
      }
      if (((long)psVar38 <= local_4f8) && (local_448[(long)psVar37] != 0)) {
        psStack_530 = (secp256k1_gej *)0x11d5bd;
        secp256k1_ecmult_table_get_ge_storage
                  ((secp256k1_ge *)local_4e8,secp256k1_pre_g_128,local_448[(long)psVar37],
                   (int)psVar36);
        state = (secp256k1_strauss_state *)local_520;
        psVar36 = (secp256k1_gej *)local_478;
        psStack_530 = (secp256k1_gej *)0x11d5d8;
        secp256k1_gej_add_zinv_var
                  (psVar13,psVar13,(secp256k1_ge *)local_4e8,(secp256k1_fe *)psVar36);
        psVar38 = local_518;
      }
      local_508 = (secp256k1_gej *)&local_508[-1].field_0x94;
    } while (1 < (long)psVar38);
  }
  if (psVar13->infinity == 0) {
    psStack_530 = (secp256k1_gej *)0x11d60e;
    secp256k1_fe_mul(&psVar13->z,&psVar13->z,(secp256k1_fe *)local_478);
  }
  return;
LAB_0011d778:
  psStack_568 = (secp256k1_gej *)0x11d77d;
  secp256k1_ecmult_wnaf_cold_3();
LAB_0011d77d:
  psStack_568 = (secp256k1_gej *)0x11d782;
  secp256k1_ecmult_wnaf_cold_5();
  psVar38 = psVar21;
  psVar35 = (secp256k1_gej *)num;
  psVar39 = a;
LAB_0011d782:
  psVar21 = psVar38;
  psStack_568 = (secp256k1_gej *)0x11d787;
  secp256k1_ecmult_wnaf_cold_4();
  goto LAB_0011d787;
LAB_0011d63e:
  psStack_530 = (secp256k1_gej *)0x11d643;
  secp256k1_ecmult_strauss_wnaf_cold_2();
LAB_0011d643:
  psStack_530 = (secp256k1_gej *)secp256k1_ecmult_wnaf;
  secp256k1_ecmult_strauss_wnaf_cold_1();
  psVar37 = psVar38;
  psStack_560 = psVar13;
  psStack_558 = psVar21;
  psStack_550 = na;
  psStack_548 = a;
  psStack_540 = (secp256k1_gej *)state;
  psStack_538 = psVar25;
  psStack_530 = (secp256k1_gej *)num;
  if (psVar13 == (secp256k1_gej *)0x0) goto LAB_0011d77d;
  psVar35 = (secp256k1_gej *)num;
  psVar39 = a;
  if (psVar38 == (secp256k1_gej *)0x0) goto LAB_0011d782;
  psVar37 = (secp256k1_gej *)0x0;
  psStack_568 = (secp256k1_gej *)0x11d67c;
  memset(psVar13,0,0x204);
  uVar17 = (uint)(psVar38->x).n[0];
  state = (secp256k1_strauss_state *)(ulong)uVar17;
  psStack_568 = (secp256k1_gej *)0x11d687;
  secp256k1_scalar_verify((secp256k1_scalar *)state);
  na = (secp256k1_scalar *)0x0;
  num = (size_t)(secp256k1_gej *)0xffffffff;
  psVar39 = (secp256k1_gej *)0x0;
  do {
    psVar35 = psVar39;
    psVar13 = (secp256k1_gej *)(ulong)uVar17;
    psStack_568 = (secp256k1_gej *)0x11d69a;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar13);
    uVar10 = (uint)psVar35;
    uVar11 = uVar17 >> ((byte)psVar35 & 0x1f);
    psVar21 = (secp256k1_gej *)(ulong)uVar11;
    psVar36 = psVar35;
    if ((uVar10 < 0x20 & uVar11) == (uint)na) {
      uVar10 = uVar10 + 1;
      psVar35 = (secp256k1_gej *)num;
    }
    else {
      uVar7 = 0x81 - uVar10;
      if ((int)uVar10 < 0x7e) {
        uVar7 = 4;
      }
      a = (secp256k1_gej *)(ulong)uVar7;
      psStack_568 = (secp256k1_gej *)0x11d6d8;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar17);
      psVar13 = (secp256k1_gej *)(ulong)uVar17;
      psStack_568 = (secp256k1_gej *)0x11d6e0;
      secp256k1_scalar_verify((secp256k1_scalar *)psVar13);
      if (uVar7 - 0x21 < 0xffffffe0) {
        psStack_568 = (secp256k1_gej *)0x11d778;
        secp256k1_ecmult_wnaf_cold_1();
        psVar25 = psVar35;
        goto LAB_0011d778;
      }
      uVar11 = uVar11 & 0xf;
      if (0x1f < uVar10) {
        uVar11 = 0;
      }
      uVar11 = uVar11 + (uint)na;
      uVar33 = uVar11 >> 3 & 1;
      na = (secp256k1_scalar *)(ulong)uVar33;
      uVar11 = uVar11 + uVar33 * -0x10;
      psVar21 = (secp256k1_gej *)(ulong)uVar11;
      *(uint *)((long)(psStack_560->x).n + (long)(int)uVar10 * 4) = uVar11;
      uVar10 = uVar7 + uVar10;
      psVar36 = psStack_560;
    }
    psVar39 = (secp256k1_gej *)(ulong)uVar10;
    num = (size_t)psVar35;
  } while ((int)uVar10 < 0x81);
  psVar25 = psVar39;
  if ((int)na == 0) {
    a = psVar39;
    if (uVar10 < 0x100) {
      do {
        psVar13 = (secp256k1_gej *)(ulong)uVar17;
        psStack_568 = (secp256k1_gej *)0x11d748;
        secp256k1_scalar_verify((secp256k1_scalar *)psVar13);
        uVar10 = (uint)a;
        if ((uVar10 < 0x20) && ((uVar17 >> (uVar10 & 0x1f) & 1) != 0)) goto LAB_0011d778;
        a = (secp256k1_gej *)(ulong)(uVar10 + 1);
      } while (uVar10 + 1 != 0x100);
    }
    return;
  }
LAB_0011d787:
  psStack_568 = (secp256k1_gej *)secp256k1_ecmult_table_get_ge_storage;
  secp256k1_ecmult_wnaf_cold_2();
  psStack_570 = psVar21;
  psStack_568 = (secp256k1_gej *)state;
  if ((extraout_RDX & 1) == 0) {
    psStack_580 = (secp256k1_gej *)0x11d852;
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_0011d852:
    psStack_580 = (secp256k1_gej *)0x11d857;
    secp256k1_ecmult_table_get_ge_storage_cold_2();
  }
  else {
    uVar17 = (uint)extraout_RDX;
    if ((int)uVar17 < -7) goto LAB_0011d852;
    if ((int)uVar17 < 8) {
      if (0 < (int)uVar17) {
        secp256k1_ge_from_storage
                  ((secp256k1_ge *)psVar13,
                   (secp256k1_ge_storage *)((long)&psVar37->x + (ulong)(uVar17 - 1 >> 1) * 0x40));
        return;
      }
      psStack_580 = (secp256k1_gej *)0x11d7df;
      secp256k1_ge_from_storage
                ((secp256k1_ge *)psVar13,
                 (secp256k1_ge_storage *)((long)&psVar37->x + (ulong)(~uVar17 >> 1) * 0x40));
      psStack_580 = (secp256k1_gej *)0x11d7eb;
      secp256k1_fe_verify(&psVar13->y);
      psStack_580 = (secp256k1_gej *)0x11d7f8;
      secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)(psVar13->y).magnitude,1);
      uVar3 = (psVar13->y).n[1];
      uVar4 = (psVar13->y).n[2];
      uVar8 = (psVar13->y).n[3];
      (psVar13->y).n[0] = 0x3ffffbfffff0bc - (psVar13->y).n[0];
      (psVar13->y).n[1] = 0x3ffffffffffffc - uVar3;
      (psVar13->y).n[2] = 0x3ffffffffffffc - uVar4;
      (psVar13->y).n[3] = 0x3ffffffffffffc - uVar8;
      (psVar13->y).n[4] = 0x3fffffffffffc - (psVar13->y).n[4];
      (psVar13->y).magnitude = 2;
      (psVar13->y).normalized = 0;
      secp256k1_fe_verify(&psVar13->y);
      return;
    }
  }
  psStack_580 = (secp256k1_gej *)secp256k1_gej_add_zinv_var;
  secp256k1_ecmult_table_get_ge_storage_cold_1();
  psStack_818 = (secp256k1_gej *)0x11d881;
  auStack_5e0._56_8_ = psVar21;
  auStack_5e0._64_8_ = na;
  auStack_5e0._72_8_ = psVar39;
  auStack_5e0._80_8_ = state;
  auStack_5e0._88_8_ = psVar25;
  psStack_580 = psVar35;
  secp256k1_gej_verify(psVar37);
  psStack_818 = (secp256k1_gej *)0x11d889;
  secp256k1_ge_verify(a_04);
  psStack_818 = (secp256k1_gej *)0x11d891;
  secp256k1_fe_verify(&psVar36->x);
  if (psVar37->infinity != 0) {
    psVar13->infinity = a_04->infinity;
    psStack_818 = (secp256k1_gej *)0x11d8bd;
    secp256k1_fe_sqr(&sStack_6a0,&psVar36->x);
    psStack_818 = (secp256k1_gej *)0x11d8d3;
    secp256k1_fe_mul(&sStack_610,&sStack_6a0,&psVar36->x);
    psStack_818 = (secp256k1_gej *)0x11d8e1;
    secp256k1_fe_mul(&psVar13->x,&a_04->x,&sStack_6a0);
    psStack_818 = (secp256k1_gej *)0x11d8f4;
    secp256k1_fe_mul(&psVar13->y,&a_04->y,&sStack_610);
    psVar36 = (secp256k1_gej *)&psVar13->z;
    (psVar13->z).n[0] = 1;
    (psVar13->z).n[1] = 0;
    (psVar13->z).n[2] = 0;
    (psVar13->z).n[3] = 0;
    (psVar13->z).n[4] = 0;
    (psVar13->z).magnitude = 1;
    (psVar13->z).normalized = 1;
LAB_0011d91f:
    psStack_818 = (secp256k1_gej *)0x11d924;
    secp256k1_fe_verify(&psVar36->x);
    psStack_818 = (secp256k1_gej *)0x11d92c;
    secp256k1_gej_verify(psVar13);
    return;
  }
  if (a_04->infinity != 0) {
    memcpy(psVar13,psVar37,0x98);
    return;
  }
  psStack_7d0 = &psVar37->z;
  psStack_818 = (secp256k1_gej *)0x11d983;
  secp256k1_fe_mul(&sStack_6a0,psStack_7d0,&psVar36->x);
  psStack_818 = (secp256k1_gej *)0x11d996;
  secp256k1_fe_sqr(&sStack_610,&sStack_6a0);
  sStack_670.n[0] = (psVar37->x).n[0];
  sStack_670.n[1] = (psVar37->x).n[1];
  sStack_670.n[2] = (psVar37->x).n[2];
  sStack_670.n[3] = (psVar37->x).n[3];
  sStack_670.n[4] = (psVar37->x).n[4];
  sStack_670.magnitude = (psVar37->x).magnitude;
  sStack_670.normalized = (psVar37->x).normalized;
  psStack_818 = (secp256k1_gej *)0x11d9cb;
  secp256k1_fe_mul((secp256k1_fe *)auStack_760,&a_04->x,&sStack_610);
  auStack_7c0._0_8_ = (psVar37->y).n[0];
  auStack_7c0._8_8_ = (psVar37->y).n[1];
  auStack_7c0._16_8_ = (psVar37->y).n[2];
  auStack_7c0._24_8_ = (psVar37->y).n[3];
  psStack_808 = psVar37;
  auStack_7c0._32_8_ = (psVar37->y).n[4];
  auStack_7c0._40_4_ = (psVar37->y).magnitude;
  auStack_7c0._44_4_ = (psVar37->y).normalized;
  psStack_818 = (secp256k1_gej *)0x11da0c;
  secp256k1_fe_mul(&sStack_640,&a_04->y,&sStack_610);
  psStack_818 = (secp256k1_gej *)0x11da1f;
  secp256k1_fe_mul(&sStack_640,&sStack_640,&sStack_6a0);
  psStack_818 = (secp256k1_gej *)0x11da27;
  secp256k1_fe_verify(&sStack_670);
  psVar25 = (secp256k1_gej *)0x4;
  psStack_818 = (secp256k1_gej *)0x11da34;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(sStack_670._40_8_ & 0xffffffff),4);
  psVar36 = (secp256k1_gej *)(0x9ffff5ffffd9d6 - sStack_670.n[0]);
  psVar21 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_670.n[1]);
  psVar23 = (secp256k1_modinv64_modinfo *)(0x9ffffffffffff6 - sStack_670.n[2]);
  psVar35 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_670.n[3]);
  uStack_810 = 0x9fffffffffff6 - sStack_670.n[4];
  uStack_6a8 = 5;
  psStack_818 = (secp256k1_gej *)0x11daa1;
  auStack_700._48_8_ = psVar36;
  psStack_6c8 = psVar21;
  psStack_6c0 = (secp256k1_gej *)psVar23;
  psStack_6b8 = psVar35;
  uStack_6b0 = uStack_810;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_700 + 0x30));
  psStack_818 = (secp256k1_gej *)0x11daa9;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_700 + 0x30));
  psVar38 = (secp256k1_gej *)auStack_760;
  psStack_818 = (secp256k1_gej *)0x11dab9;
  psVar37 = psVar38;
  secp256k1_fe_verify((secp256k1_fe *)psVar38);
  if ((int)auStack_760._40_4_ < 0x1c) {
    psStack_7c8 = (secp256k1_gej *)((long)(psVar36->x).n + auStack_760._0_8_);
    psStack_7d8 = (secp256k1_gej *)((long)(psVar21->x).n + auStack_760._8_8_);
    psStack_7e8 = (secp256k1_gej *)((long)(((secp256k1_gej *)psVar23)->x).n + auStack_760._16_8_);
    psStack_7e0 = (secp256k1_gej *)((long)(psVar35->x).n + auStack_760._24_8_);
    uStack_810 = uStack_810 + auStack_760._32_8_;
    uStack_6a8 = (ulong)(auStack_760._40_4_ + 5);
    psStack_818 = (secp256k1_gej *)0x11db37;
    auStack_700._48_8_ = psStack_7c8;
    psStack_6c8 = psStack_7d8;
    psStack_6c0 = psStack_7e8;
    psStack_6b8 = psStack_7e0;
    uStack_6b0 = uStack_810;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_700 + 0x30));
    psStack_818 = (secp256k1_gej *)0x11db47;
    secp256k1_fe_verify(&sStack_640);
    psVar25 = (secp256k1_gej *)0x1;
    psStack_818 = (secp256k1_gej *)0x11db55;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)sStack_640.magnitude,1);
    psVar35 = (secp256k1_gej *)(0x3ffffbfffff0bc - sStack_640.n[0]);
    psVar23 = (secp256k1_modinv64_modinfo *)(0x3ffffffffffffc - sStack_640.n[1]);
    psVar21 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_640.n[2]);
    psVar38 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_640.n[3]);
    psVar36 = (secp256k1_gej *)(0x3fffffffffffc - sStack_640.n[4]);
    uStack_708 = 2;
    psStack_818 = (secp256k1_gej *)0x11dbb7;
    auStack_760._48_8_ = psVar35;
    psStack_728 = (secp256k1_gej *)psVar23;
    psStack_720 = psVar21;
    psStack_718 = psVar38;
    psStack_710 = psVar36;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_760 + 0x30));
    psStack_818 = (secp256k1_gej *)0x11dbc4;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_760 + 0x30));
    psVar37 = (secp256k1_gej *)auStack_7c0;
    psStack_818 = (secp256k1_gej *)0x11dbce;
    secp256k1_fe_verify((secp256k1_fe *)psVar37);
    if (0x1e < (int)auStack_7c0._40_4_) goto LAB_0011e0cd;
    psStack_7f8 = (secp256k1_gej *)((long)(psVar35->x).n + auStack_7c0._0_8_);
    psStack_7f0 = (secp256k1_gej *)((long)(((secp256k1_gej *)psVar23)->x).n + auStack_7c0._8_8_);
    psStack_800 = (secp256k1_gej *)((long)(psVar21->x).n + auStack_7c0._16_8_);
    psVar21 = (secp256k1_gej *)((long)(psVar38->x).n + auStack_7c0._24_8_);
    psVar23 = (secp256k1_modinv64_modinfo *)((long)(psVar36->x).n + auStack_7c0._32_8_);
    uStack_708 = (ulong)(auStack_7c0._40_4_ + 2);
    psStack_818 = (secp256k1_gej *)0x11dc37;
    auStack_760._48_8_ = psStack_7f8;
    psStack_728 = psStack_7f0;
    psStack_720 = psStack_800;
    psStack_718 = psVar21;
    psStack_710 = (secp256k1_gej *)psVar23;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_760 + 0x30));
    psStack_818 = (secp256k1_gej *)0x11dc44;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_700 + 0x30));
    puVar12 = (undefined1 *)((uStack_810 >> 0x30) * 0x1000003d1 + (long)psStack_7c8);
    if ((((ulong)puVar12 & 0xfffffffffffff) == 0xffffefffffc2f) ||
       (((ulong)puVar12 & 0xfffffffffffff) == 0)) {
      uVar18 = (long)(psStack_7d8->x).n + ((ulong)puVar12 >> 0x34);
      puVar15 = (undefined1 *)((long)(psStack_7e8->x).n + (uVar18 >> 0x34));
      uVar20 = (long)(psStack_7e0->x).n + ((ulong)puVar15 >> 0x34);
      uVar26 = (uVar20 >> 0x34) + (uStack_810 & 0xffffffffffff);
      if ((((uVar18 | (ulong)puVar12 | (ulong)puVar15 | uVar20) & 0xfffffffffffff) == 0 &&
           uVar26 == 0) ||
         ((((ulong)puVar12 | 0x1000003d0) & uVar18 & (ulong)puVar15 & uVar20 &
          (uVar26 ^ 0xf000000000000)) == 0xfffffffffffff)) {
        psStack_818 = (secp256k1_gej *)0x11e009;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_760 + 0x30));
        uVar20 = ((ulong)psVar23 >> 0x30) * 0x1000003d1 + (long)psStack_7f8;
        if (((uVar20 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar20 & 0xfffffffffffff) == 0)) {
          puVar12 = (undefined1 *)((long)(psStack_7f0->x).n + (uVar20 >> 0x34));
          uVar26 = (long)(psStack_800->x).n + ((ulong)puVar12 >> 0x34);
          uVar18 = (long)(psVar21->x).n + (uVar26 >> 0x34);
          uVar19 = (uVar18 >> 0x34) + ((ulong)psVar23 & 0xffffffffffff);
          if (((((ulong)puVar12 | uVar20 | uVar26 | uVar18) & 0xfffffffffffff) == 0 && uVar19 == 0)
             || (((uVar20 | 0x1000003d0) & (ulong)puVar12 & uVar26 & uVar18 &
                 (uVar19 ^ 0xf000000000000)) == 0xfffffffffffff)) {
            psStack_818 = (secp256k1_gej *)0x11e0c3;
            secp256k1_gej_double_var(psVar13,psStack_808,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_818 = (secp256k1_gej *)0x11e0af;
        secp256k1_gej_set_infinity(psVar13);
        return;
      }
    }
    psVar13->infinity = 0;
    psVar38 = (secp256k1_gej *)(auStack_700 + 0x30);
    psStack_818 = (secp256k1_gej *)0x11dd2b;
    secp256k1_fe_mul(&psVar13->z,psStack_7d0,(secp256k1_fe *)psVar38);
    psVar36 = (secp256k1_gej *)auStack_5e0;
    psStack_818 = (secp256k1_gej *)0x11dd3e;
    secp256k1_fe_sqr((secp256k1_fe *)psVar36,(secp256k1_fe *)psVar38);
    psStack_818 = (secp256k1_gej *)0x11dd46;
    secp256k1_fe_verify((secp256k1_fe *)psVar36);
    psStack_818 = (secp256k1_gej *)0x11dd54;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(auStack_5e0._40_8_ & 0xffffffff),1);
    auStack_5e0._0_8_ = 0x3ffffbfffff0bc - auStack_5e0._0_8_;
    auStack_5e0._8_8_ = 0x3ffffffffffffc - auStack_5e0._8_8_;
    auStack_5e0._16_8_ = 0x3ffffffffffffc - auStack_5e0._16_8_;
    auStack_5e0._24_8_ = 0x3ffffffffffffc - auStack_5e0._24_8_;
    auStack_5e0._32_8_ = 0x3fffffffffffc - auStack_5e0._32_8_;
    auStack_5e0._40_8_ = 2;
    psStack_818 = (secp256k1_gej *)0x11dd9c;
    secp256k1_fe_verify((secp256k1_fe *)psVar36);
    psVar35 = (secp256k1_gej *)(auStack_7c0 + 0x30);
    psStack_818 = (secp256k1_gej *)0x11ddb2;
    secp256k1_fe_mul((secp256k1_fe *)psVar35,(secp256k1_fe *)psVar36,(secp256k1_fe *)psVar38);
    psStack_818 = (secp256k1_gej *)0x11ddca;
    secp256k1_fe_mul((secp256k1_fe *)auStack_700,&sStack_670,(secp256k1_fe *)psVar36);
    psVar25 = (secp256k1_gej *)(auStack_760 + 0x30);
    psStack_818 = (secp256k1_gej *)0x11ddda;
    secp256k1_fe_sqr(&psVar13->x,(secp256k1_fe *)psVar25);
    psStack_818 = (secp256k1_gej *)0x11dde2;
    secp256k1_fe_verify(&psVar13->x);
    psStack_818 = (secp256k1_gej *)0x11ddea;
    psVar37 = psVar35;
    secp256k1_fe_verify((secp256k1_fe *)psVar35);
    iVar9 = iStack_768 + (psVar13->x).magnitude;
    if (0x20 < iVar9) goto LAB_0011e0d2;
    uVar3 = (psVar13->x).n[1];
    uVar4 = (psVar13->x).n[2];
    uVar8 = (psVar13->x).n[3];
    (psVar13->x).n[0] = (psVar13->x).n[0] + auStack_7c0._48_8_;
    (psVar13->x).n[1] = uVar3 + uStack_788;
    (psVar13->x).n[2] = uVar4 + uStack_780;
    (psVar13->x).n[3] = uVar8 + uStack_778;
    puVar29 = (psVar13->x).n + 4;
    *puVar29 = *puVar29 + uStack_770;
    (psVar13->x).magnitude = iVar9;
    (psVar13->x).normalized = 0;
    psStack_818 = (secp256k1_gej *)0x11de3d;
    secp256k1_fe_verify(&psVar13->x);
    psStack_818 = (secp256k1_gej *)0x11de45;
    secp256k1_fe_verify(&psVar13->x);
    psVar36 = (secp256k1_gej *)auStack_700;
    psStack_818 = (secp256k1_gej *)0x11de55;
    psVar37 = psVar36;
    secp256k1_fe_verify((secp256k1_fe *)psVar36);
    iVar9 = auStack_700._40_4_ + (psVar13->x).magnitude;
    if (0x20 < iVar9) goto LAB_0011e0d7;
    uVar3 = (psVar13->x).n[1];
    uVar4 = (psVar13->x).n[2];
    uVar8 = (psVar13->x).n[3];
    psVar36 = (secp256k1_gej *)auStack_700;
    (psVar13->x).n[0] = (psVar13->x).n[0] + auStack_700._0_8_;
    (psVar13->x).n[1] = uVar3 + auStack_700._8_8_;
    (psVar13->x).n[2] = uVar4 + auStack_700._16_8_;
    (psVar13->x).n[3] = uVar8 + auStack_700._24_8_;
    puVar29 = (psVar13->x).n + 4;
    *puVar29 = *puVar29 + auStack_700._32_8_;
    (psVar13->x).magnitude = iVar9;
    (psVar13->x).normalized = 0;
    psStack_818 = (secp256k1_gej *)0x11dea4;
    secp256k1_fe_verify(&psVar13->x);
    psStack_818 = (secp256k1_gej *)0x11deac;
    secp256k1_fe_verify(&psVar13->x);
    psStack_818 = (secp256k1_gej *)0x11deb4;
    psVar37 = psVar36;
    secp256k1_fe_verify((secp256k1_fe *)psVar36);
    iVar9 = auStack_700._40_4_ + (psVar13->x).magnitude;
    if (0x20 < iVar9) goto LAB_0011e0dc;
    uVar3 = (psVar13->x).n[1];
    uVar4 = (psVar13->x).n[2];
    uVar8 = (psVar13->x).n[3];
    psVar36 = (secp256k1_gej *)auStack_700;
    (psVar13->x).n[0] = (psVar13->x).n[0] + auStack_700._0_8_;
    (psVar13->x).n[1] = uVar3 + auStack_700._8_8_;
    (psVar13->x).n[2] = uVar4 + auStack_700._16_8_;
    (psVar13->x).n[3] = uVar8 + auStack_700._24_8_;
    puVar29 = (psVar13->x).n + 4;
    *puVar29 = *puVar29 + auStack_700._32_8_;
    (psVar13->x).magnitude = iVar9;
    (psVar13->x).normalized = 0;
    psStack_818 = (secp256k1_gej *)0x11df03;
    secp256k1_fe_verify(&psVar13->x);
    psStack_818 = (secp256k1_gej *)0x11df0b;
    secp256k1_fe_verify((secp256k1_fe *)psVar36);
    psStack_818 = (secp256k1_gej *)0x11df13;
    psVar37 = psVar13;
    secp256k1_fe_verify(&psVar13->x);
    iVar9 = (psVar13->x).magnitude + auStack_700._40_4_;
    if (0x20 < iVar9) goto LAB_0011e0e1;
    auStack_700._0_8_ = (psVar13->x).n[0] + auStack_700._0_8_;
    auStack_700._8_8_ = (psVar13->x).n[1] + auStack_700._8_8_;
    auStack_700._16_8_ = (psVar13->x).n[2] + auStack_700._16_8_;
    auStack_700._24_8_ = (psVar13->x).n[3] + auStack_700._24_8_;
    auStack_700._32_8_ = auStack_700._32_8_ + (psVar13->x).n[4];
    auStack_700._44_4_ = 0;
    psStack_818 = (secp256k1_gej *)0x11df66;
    auStack_700._40_4_ = iVar9;
    secp256k1_fe_verify((secp256k1_fe *)auStack_700);
    psVar36 = (secp256k1_gej *)&psVar13->y;
    psStack_818 = (secp256k1_gej *)0x11df7d;
    secp256k1_fe_mul((secp256k1_fe *)psVar36,(secp256k1_fe *)auStack_700,
                     (secp256k1_fe *)(auStack_760 + 0x30));
    psVar38 = (secp256k1_gej *)(auStack_7c0 + 0x30);
    psStack_818 = (secp256k1_gej *)0x11df95;
    psVar25 = psVar38;
    secp256k1_fe_mul((secp256k1_fe *)psVar38,(secp256k1_fe *)psVar38,(secp256k1_fe *)auStack_7c0);
    psStack_818 = (secp256k1_gej *)0x11df9d;
    secp256k1_fe_verify((secp256k1_fe *)psVar36);
    psStack_818 = (secp256k1_gej *)0x11dfa5;
    psVar37 = psVar38;
    secp256k1_fe_verify((secp256k1_fe *)psVar38);
    iStack_768 = iStack_768 + (psVar13->y).magnitude;
    if (iStack_768 < 0x21) {
      uVar3 = (psVar13->y).n[1];
      uVar4 = (psVar13->y).n[2];
      uVar8 = (psVar13->y).n[3];
      (psVar13->y).n[0] = (psVar13->y).n[0] + auStack_7c0._48_8_;
      (psVar13->y).n[1] = uVar3 + uStack_788;
      (psVar13->y).n[2] = uVar4 + uStack_780;
      (psVar13->y).n[3] = uVar8 + uStack_778;
      puVar29 = (psVar13->y).n + 4;
      *puVar29 = *puVar29 + uStack_770;
      (psVar13->y).magnitude = iStack_768;
      (psVar13->y).normalized = 0;
      goto LAB_0011d91f;
    }
  }
  else {
    psStack_818 = (secp256k1_gej *)0x11e0cd;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_0011e0cd:
    psStack_818 = (secp256k1_gej *)0x11e0d2;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0011e0d2:
    psStack_818 = (secp256k1_gej *)0x11e0d7;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0011e0d7:
    psStack_818 = (secp256k1_gej *)0x11e0dc;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_0011e0dc:
    psStack_818 = (secp256k1_gej *)0x11e0e1;
    secp256k1_gej_add_zinv_var_cold_3();
LAB_0011e0e1:
    psStack_818 = (secp256k1_gej *)0x11e0e6;
    secp256k1_gej_add_zinv_var_cold_2();
  }
  psStack_818 = (secp256k1_gej *)secp256k1_fe_inv_var;
  secp256k1_gej_add_zinv_var_cold_1();
  psVar39 = (secp256k1_gej *)0xf000000000000;
  psStack_9c0 = (secp256k1_gej *)0x11e134;
  psStack_980 = psVar37;
  auStack_878._56_8_ = psVar13;
  auStack_878._64_8_ = psVar35;
  auStack_878._72_8_ = psVar21;
  auStack_878._80_8_ = psVar36;
  auStack_878._88_8_ = psVar38;
  psStack_818 = (secp256k1_gej *)psVar23;
  secp256k1_fe_verify(&psVar25->x);
  uVar20 = (psVar25->x).n[4];
  lStack_998 = 0x1000003d1;
  uVar26 = (uVar20 >> 0x30) * 0x1000003d1 + (psVar25->x).n[0];
  uVar27 = (uVar26 >> 0x34) + (psVar25->x).n[1];
  uVar18 = (uVar27 >> 0x34) + (psVar25->x).n[2];
  uVar19 = (uVar18 >> 0x34) + (psVar25->x).n[3];
  uVar20 = (uVar19 >> 0x34) + (uVar20 & 0xffffffffffff);
  uStack_988 = (uVar27 | uVar26 | uVar18 | uVar19) & 0xfffffffffffff | uVar20;
  uStack_990 = (uVar26 ^ 0x1000003d0) & uVar27 & uVar18 & uVar19 & (uVar20 ^ 0xf000000000000);
  psStack_9c0 = (secp256k1_gej *)0x11e1ae;
  secp256k1_fe_verify(&psVar25->x);
  auStack_878._0_8_ = (psVar25->x).n[0];
  auStack_878._8_8_ = (psVar25->x).n[1];
  auStack_878._16_8_ = (psVar25->x).n[2];
  auStack_878._24_8_ = (psVar25->x).n[3];
  auStack_878._32_8_ = (psVar25->x).n[4];
  auStack_878._40_4_ = (psVar25->x).magnitude;
  auStack_878._44_4_ = (psVar25->x).normalized;
  psVar36 = (secp256k1_gej *)auStack_878;
  psStack_9c0 = (secp256k1_gej *)0x11e1dd;
  psStack_9a0 = psVar25;
  secp256k1_fe_normalize_var((secp256k1_fe *)psVar36);
  auStack_978._0_8_ = (auStack_878._8_8_ << 0x34 | auStack_878._0_8_) & 0x3fffffffffffffff;
  auStack_978._8_8_ =
       (ulong)((uint)auStack_878._16_8_ & 0xfffff) << 0x2a | (ulong)auStack_878._8_8_ >> 10;
  auStack_978._16_8_ =
       (ulong)((uint)auStack_878._24_8_ & 0x3fffffff) << 0x20 | (ulong)auStack_878._16_8_ >> 0x14;
  auStack_978._24_8_ =
       (auStack_878._32_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_878._24_8_ >> 0x1e;
  auStack_978._32_8_ = (ulong)auStack_878._32_8_ >> 0x28;
  auStack_8c8._16_8_ = 0;
  auStack_8c8._24_8_ = 0;
  auStack_8c8._0_8_ = (undefined1 *)0x0;
  auStack_8c8._8_8_ = 0;
  auStack_8c8._32_8_ = 0;
  uStack_888 = 0;
  uStack_880 = 0;
  uStack_898 = 0;
  uStack_890 = 0;
  auStack_8c8._40_8_ = 1;
  uStack_938 = 0;
  uStack_930 = 0;
  auStack_978._48_8_ = -0x1000003d1;
  uStack_940 = 0;
  auStack_928[0] = 0x100;
  psStack_9a8 = (secp256k1_gej *)0x0;
  psVar37 = (secp256k1_gej *)0xffffffffffffffff;
  uStack_9ac = 5;
  auStack_918._0_8_ = auStack_978._0_8_;
  auStack_918._8_8_ = auStack_978._8_8_;
  auStack_918._16_8_ = auStack_978._16_8_;
  auStack_918._24_8_ = auStack_978._24_8_;
  auStack_918._32_8_ = auStack_978._32_8_;
LAB_0011e2f3:
  psVar35 = (secp256k1_gej *)auStack_978._48_8_;
  psVar13 = (secp256k1_gej *)0x0;
  psVar31 = (secp256k1_gej *)0x0;
  psVar25 = (secp256k1_gej *)0x1;
  uVar17 = 0x3e;
  psVar21 = (secp256k1_gej *)0x1;
  puVar12 = (undefined1 *)auStack_918._0_8_;
  psVar38 = (secp256k1_gej *)auStack_978._48_8_;
  while( true ) {
    r_00 = (secp256k1_gej *)(-1L << ((byte)uVar17 & 0x3f) | (ulong)puVar12);
    psVar16 = (secp256k1_gej *)0x0;
    if (r_00 != (secp256k1_gej *)0x0) {
      for (; ((ulong)r_00 >> (long)psVar16 & 1) == 0;
          psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + 1)) {
      }
    }
    bVar41 = (byte)psVar16;
    psVar32 = (secp256k1_gej *)((ulong)puVar12 >> (bVar41 & 0x3f));
    psVar21 = (secp256k1_gej *)((long)psVar21 << (bVar41 & 0x3f));
    psVar13 = (secp256k1_gej *)((long)psVar13 << (bVar41 & 0x3f));
    psVar37 = (secp256k1_gej *)((long)psVar37 - (long)psVar16);
    uVar17 = uVar17 - (int)psVar16;
    if (uVar17 == 0) break;
    if (((ulong)psVar38 & 1) == 0) {
      psStack_9c0 = (secp256k1_gej *)0x11e867;
      secp256k1_fe_inv_var_cold_8();
LAB_0011e867:
      psStack_9c0 = (secp256k1_gej *)0x11e86c;
      secp256k1_fe_inv_var_cold_7();
LAB_0011e86c:
      psStack_9c0 = (secp256k1_gej *)0x11e871;
      secp256k1_fe_inv_var_cold_1();
LAB_0011e871:
      psStack_9c0 = (secp256k1_gej *)0x11e876;
      secp256k1_fe_inv_var_cold_2();
LAB_0011e876:
      psStack_9c0 = (secp256k1_gej *)0x11e87b;
      secp256k1_fe_inv_var_cold_6();
      psVar32 = psVar38;
      goto LAB_0011e87b;
    }
    if (((ulong)psVar32 & 1) == 0) goto LAB_0011e867;
    r_00 = (secp256k1_gej *)((long)psVar13 * auStack_918._0_8_ + (long)psVar21 * auStack_978._48_8_)
    ;
    psVar16 = (secp256k1_gej *)(ulong)(0x3e - uVar17);
    bVar41 = (byte)(0x3e - uVar17);
    psVar36 = (secp256k1_gej *)((long)psVar38 << (bVar41 & 0x3f));
    if (r_00 != psVar36) goto LAB_0011e86c;
    psVar36 = (secp256k1_gej *)
              ((long)psVar25 * auStack_918._0_8_ + (long)psVar31 * auStack_978._48_8_);
    r_00 = (secp256k1_gej *)((long)psVar32 << (bVar41 & 0x3f));
    if (psVar36 != r_00) goto LAB_0011e871;
    psVar16 = (secp256k1_gej *)((long)psVar37[-5].x.n + 0xe);
    if (psVar16 < (secp256k1_gej *)0xfffffffffffffa2d) goto LAB_0011e876;
    iVar9 = (int)psVar32;
    if ((long)psVar37 < 0) {
      psVar37 = (secp256k1_gej *)-(long)psVar37;
      uVar10 = (int)psVar37 + 1;
      if ((int)uVar17 <= (int)uVar10) {
        uVar10 = uVar17;
      }
      psVar16 = (secp256k1_gej *)(ulong)uVar10;
      r_00 = (secp256k1_gej *)(ulong)(uVar10 - 0x3f);
      if (0xffffffc1 < uVar10 - 0x3f) {
        psVar40 = (secp256k1_gej *)-(long)psVar13;
        psVar23 = (secp256k1_modinv64_modinfo *)-(long)psVar21;
        psVar16 = (secp256k1_gej *)-(long)psVar38;
        psVar36 = (secp256k1_gej *)
                  ((ulong)(0x3fL << (-(char)uVar10 & 0x3fU)) >> (-(char)uVar10 & 0x3fU));
        uVar10 = (iVar9 * iVar9 + 0x3e) * iVar9 * (int)psVar16 & (uint)psVar36;
        psVar13 = psVar25;
        psVar21 = psVar31;
        psVar39 = psVar40;
        goto LAB_0011e44d;
      }
      goto LAB_0011e885;
    }
    uVar10 = (int)psVar37 + 1;
    if ((int)uVar17 <= (int)uVar10) {
      uVar10 = uVar17;
    }
    psVar16 = (secp256k1_gej *)(ulong)uVar10;
    r_00 = (secp256k1_gej *)(ulong)(uVar10 - 0x3f);
    if (uVar10 - 0x3f < 0xffffffc2) goto LAB_0011e880;
    psVar36 = (secp256k1_gej *)((ulong)(0xfL << (-(char)uVar10 & 0x3fU)) >> (-(char)uVar10 & 0x3fU))
    ;
    uVar10 = -(iVar9 * (((int)psVar38 * 2 + 2U & 8) + (int)psVar38)) & (uint)psVar36;
    psVar23 = (secp256k1_modinv64_modinfo *)psVar31;
    psVar40 = psVar25;
    psVar16 = psVar32;
    psVar32 = psVar38;
LAB_0011e44d:
    uVar20 = (ulong)uVar10;
    r_00 = (secp256k1_gej *)(uVar20 * (long)psVar32);
    puVar12 = (undefined1 *)((long)(psVar16->x).n + (long)(r_00->x).n);
    psVar31 = (secp256k1_gej *)((long)(((secp256k1_gej *)psVar23)->x).n + (long)psVar21 * uVar20);
    psVar16 = (secp256k1_gej *)(uVar20 * (long)psVar13);
    psVar25 = (secp256k1_gej *)((long)(psVar40->x).n + (long)(psVar16->x).n);
    psVar38 = psVar32;
    if (((ulong)puVar12 & (ulong)psVar36) != 0) {
LAB_0011e87b:
      psStack_9c0 = (secp256k1_gej *)0x11e880;
      secp256k1_fe_inv_var_cold_4();
      psVar38 = psVar32;
LAB_0011e880:
      psStack_9c0 = (secp256k1_gej *)0x11e885;
      secp256k1_fe_inv_var_cold_3();
LAB_0011e885:
      psStack_9c0 = (secp256k1_gej *)0x11e88a;
      secp256k1_fe_inv_var_cold_5();
      goto LAB_0011e88a;
    }
  }
  r_00 = (secp256k1_gej *)((long)psVar13 * (long)psVar31);
  psVar16 = SUB168(SEXT816((long)psVar13) * SEXT816((long)psVar31),8);
  psStack_9e0 = (secp256k1_gej *)auStack_978._48_8_;
  auStack_918._48_8_ = psVar21;
  psStack_8e0 = psVar13;
  psStack_8d8 = psVar31;
  psStack_8d0 = psVar25;
  if ((long)psVar21 * (long)psVar25 - (long)r_00 != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar21) * SEXT816((long)psVar25),8) - (long)psVar16 !=
      (ulong)((secp256k1_gej *)((long)psVar21 * (long)psVar25) < r_00)) goto LAB_0011e8c6;
  psStack_9c0 = (secp256k1_gej *)0x11e4d3;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)auStack_8c8,
             (secp256k1_modinv64_signed62 *)(auStack_8c8 + 0x28),
             (secp256k1_modinv64_trans2x2 *)(auStack_918 + 0x30),
             (secp256k1_modinv64_modinfo *)psVar16);
  uVar17 = uStack_9ac;
  psVar39 = (secp256k1_gej *)(auStack_978 + 0x30);
  psVar36 = (secp256k1_gej *)(ulong)uStack_9ac;
  psVar21 = (secp256k1_gej *)(ulong)uStack_9ac;
  psVar23 = &secp256k1_const_modinfo_fe;
  psVar16 = (secp256k1_gej *)0xffffffffffffffff;
  psStack_9c0 = (secp256k1_gej *)0x11e4f7;
  r_00 = psVar39;
  iVar9 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar39,uStack_9ac,
                     &secp256k1_const_modinfo_fe.modulus,-1);
  psVar38 = psStack_9a8;
  psVar35 = (secp256k1_gej *)auStack_918;
  if (0 < iVar9) {
    psVar16 = (secp256k1_gej *)0x1;
    psVar21 = (secp256k1_gej *)(ulong)uVar17;
    psStack_9c0 = (secp256k1_gej *)0x11e51e;
    r_00 = psVar39;
    iVar9 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar39,uVar17,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar9) goto LAB_0011e88f;
    psVar21 = (secp256k1_gej *)(ulong)uVar17;
    psVar16 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_9c0 = (secp256k1_gej *)0x11e53a;
    r_00 = psVar35;
    iVar9 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar35,uVar17,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar9 < 1) goto LAB_0011e894;
    psVar16 = (secp256k1_gej *)0x1;
    psVar21 = (secp256k1_gej *)(ulong)uVar17;
    psStack_9c0 = (secp256k1_gej *)0x11e554;
    r_00 = psVar35;
    iVar9 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar35,uVar17,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar9) goto LAB_0011e899;
    psStack_9c0 = (secp256k1_gej *)0x11e571;
    secp256k1_modinv64_update_fg_62_var
              (uVar17,(secp256k1_modinv64_signed62 *)psVar39,(secp256k1_modinv64_signed62 *)psVar35,
               (secp256k1_modinv64_trans2x2 *)(auStack_918 + 0x30));
    if ((undefined1 *)auStack_918._0_8_ == (undefined1 *)0x0) {
      if (1 < (int)uVar17) {
        uVar20 = 1;
        uVar26 = 0;
        do {
          uVar26 = uVar26 | *(ulong *)(auStack_918 + uVar20 * 8);
          uVar20 = uVar20 + 1;
        } while (uVar17 != uVar20);
        if (uVar26 != 0) goto LAB_0011e5a7;
      }
      r_00 = (secp256k1_gej *)auStack_918;
      psVar21 = (secp256k1_gej *)(ulong)uVar17;
      psVar16 = (secp256k1_gej *)0x0;
      psStack_9c0 = (secp256k1_gej *)0x11e69d;
      iVar9 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)r_00,uVar17,&SECP256K1_SIGNED62_ONE,0);
      if (iVar9 != 0) goto LAB_0011e8b7;
      psStack_9c0 = (secp256k1_gej *)0x11e6bf;
      iVar9 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)(auStack_978 + 0x30),uVar17,
                         &SECP256K1_SIGNED62_ONE,-1);
      modinfo = extraout_RDX_00;
      if (iVar9 != 0) {
        psStack_9c0 = (secp256k1_gej *)0x11e6db;
        iVar9 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)(auStack_978 + 0x30),uVar17,
                           &SECP256K1_SIGNED62_ONE,1);
        modinfo = extraout_RDX_01;
        if (iVar9 != 0) {
          r_00 = (secp256k1_gej *)auStack_978;
          psVar21 = (secp256k1_gej *)0x5;
          psVar16 = (secp256k1_gej *)0x0;
          psStack_9c0 = (secp256k1_gej *)0x11e6f7;
          iVar9 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r_00,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar9 != 0) goto LAB_0011e8c1;
          r_00 = (secp256k1_gej *)auStack_8c8;
          psVar21 = (secp256k1_gej *)0x5;
          psVar16 = (secp256k1_gej *)0x0;
          psStack_9c0 = (secp256k1_gej *)0x11e71a;
          iVar9 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r_00,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar9 != 0) goto LAB_0011e8c1;
          r_00 = (secp256k1_gej *)(auStack_978 + 0x30);
          psVar16 = (secp256k1_gej *)0x1;
          psVar21 = (secp256k1_gej *)(ulong)uVar17;
          psStack_9c0 = (secp256k1_gej *)0x11e73a;
          iVar9 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r_00,uVar17,
                             &secp256k1_const_modinfo_fe.modulus,1);
          modinfo = extraout_RDX_02;
          if (iVar9 != 0) goto LAB_0011e8c1;
        }
      }
      psStack_9c0 = (secp256k1_gej *)0x11e75a;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_8c8,
                 *(int64_t *)(auStack_978 + (long)(int)uVar17 * 8 + 0x28),modinfo);
      psVar36 = psStack_980;
      auStack_978._32_8_ = auStack_8c8._32_8_;
      auStack_978._16_8_ = auStack_8c8._16_8_;
      auStack_978._24_8_ = auStack_8c8._24_8_;
      auStack_978._0_8_ = auStack_8c8._0_8_;
      auStack_978._8_8_ = auStack_8c8._8_8_;
      psStack_9c0 = (secp256k1_gej *)0x11e782;
      secp256k1_fe_from_signed62(&psStack_980->x,(secp256k1_modinv64_signed62 *)auStack_978);
      (psVar36->x).magnitude = (uint)(0 < (psStack_9a0->x).magnitude);
      (psVar36->x).normalized = 1;
      psStack_9c0 = (secp256k1_gej *)0x11e7a2;
      secp256k1_fe_verify(&psVar36->x);
      uVar20 = (psVar36->x).n[4];
      psVar25 = (secp256k1_gej *)(uVar20 & 0xffffffffffff);
      uVar26 = (uVar20 >> 0x30) * lStack_998 + (psVar36->x).n[0];
      uVar20 = (uVar26 >> 0x34) + (psVar36->x).n[1];
      uVar18 = (uVar20 >> 0x34) + (psVar36->x).n[2];
      uVar19 = (uVar18 >> 0x34) + (psVar36->x).n[3];
      psVar21 = (secp256k1_gej *)((long)(psVar25->x).n + (uVar19 >> 0x34));
      r_00 = (secp256k1_gej *)
             ((uVar26 ^ 0x1000003d0) & uVar20 & uVar18 & uVar19 & ((ulong)psVar21 ^ 0xf000000000000)
             );
      bVar14 = r_00 == (secp256k1_gej *)0xfffffffffffff ||
               ((uVar20 | uVar26 | uVar18 | uVar19) & 0xfffffffffffff) == 0 &&
               psVar21 == (secp256k1_gej *)0x0;
      psVar16 = (secp256k1_gej *)CONCAT71((int7)(((ulong)psVar21 ^ 0xf000000000000) >> 8),bVar14);
      if ((uStack_990 != 0xfffffffffffff && uStack_988 != 0) != bVar14) {
        secp256k1_fe_verify(&psVar36->x);
        return;
      }
      goto LAB_0011e8bc;
    }
LAB_0011e5a7:
    lVar34 = (long)(int)uVar17;
    uVar20 = *(ulong *)(auStack_978 + lVar34 * 8 + 0x28);
    psVar16 = (secp256k1_gej *)auStack_928[lVar34 + 1];
    r_00 = (secp256k1_gej *)((long)uVar20 >> 0x3f ^ uVar20 | lVar34 + -2 >> 0x3f);
    psVar21 = (secp256k1_gej *)((long)psVar16 >> 0x3f ^ (ulong)psVar16 | (ulong)r_00);
    if (psVar21 == (secp256k1_gej *)0x0) {
      psVar36 = (secp256k1_gej *)(ulong)(uVar17 - 1);
      *(ulong *)(auStack_978 + lVar34 * 8 + 0x20) =
           *(ulong *)(auStack_978 + lVar34 * 8 + 0x20) | uVar20 << 0x3e;
      psVar16 = (secp256k1_gej *)((long)psVar16 << 0x3e);
      auStack_928[lVar34] = auStack_928[lVar34] | (ulong)psVar16;
    }
    if ((int)psVar38 == 0xb) goto LAB_0011e89e;
    uVar17 = (uint)psVar36;
    psVar23 = &secp256k1_const_modinfo_fe;
    psVar16 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_9c0 = (secp256k1_gej *)0x11e617;
    psVar21 = psVar36;
    r_00 = psVar39;
    iVar9 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar39,uVar17,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar9 < 1) goto LAB_0011e8a3;
    psVar16 = (secp256k1_gej *)0x1;
    psStack_9c0 = (secp256k1_gej *)0x11e631;
    psVar21 = psVar36;
    r_00 = psVar39;
    iVar9 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar39,uVar17,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar9) goto LAB_0011e8a8;
    psVar16 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_9c0 = (secp256k1_gej *)0x11e64d;
    psVar21 = psVar36;
    r_00 = psVar35;
    iVar9 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar35,uVar17,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar9 < 1) goto LAB_0011e8ad;
    psVar16 = (secp256k1_gej *)0x1;
    psStack_9c0 = (secp256k1_gej *)0x11e667;
    psVar21 = psVar36;
    r_00 = psVar35;
    iVar9 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar35,uVar17,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar9) goto LAB_0011e8b2;
    psStack_9a8 = (secp256k1_gej *)(ulong)((int)psVar38 + 1);
    uStack_9ac = uVar17;
    goto LAB_0011e2f3;
  }
LAB_0011e88a:
  psStack_9c0 = (secp256k1_gej *)0x11e88f;
  secp256k1_fe_inv_var_cold_21();
LAB_0011e88f:
  psStack_9c0 = (secp256k1_gej *)0x11e894;
  secp256k1_fe_inv_var_cold_20();
LAB_0011e894:
  psStack_9c0 = (secp256k1_gej *)0x11e899;
  secp256k1_fe_inv_var_cold_19();
LAB_0011e899:
  psStack_9c0 = (secp256k1_gej *)0x11e89e;
  secp256k1_fe_inv_var_cold_18();
LAB_0011e89e:
  psStack_9c0 = (secp256k1_gej *)0x11e8a3;
  secp256k1_fe_inv_var_cold_14();
LAB_0011e8a3:
  psStack_9c0 = (secp256k1_gej *)0x11e8a8;
  secp256k1_fe_inv_var_cold_13();
LAB_0011e8a8:
  psStack_9c0 = (secp256k1_gej *)0x11e8ad;
  secp256k1_fe_inv_var_cold_12();
LAB_0011e8ad:
  psStack_9c0 = (secp256k1_gej *)0x11e8b2;
  secp256k1_fe_inv_var_cold_11();
LAB_0011e8b2:
  psStack_9c0 = (secp256k1_gej *)0x11e8b7;
  secp256k1_fe_inv_var_cold_10();
LAB_0011e8b7:
  psStack_9c0 = (secp256k1_gej *)0x11e8bc;
  secp256k1_fe_inv_var_cold_15();
LAB_0011e8bc:
  psStack_9c0 = (secp256k1_gej *)0x11e8c1;
  secp256k1_fe_inv_var_cold_17();
LAB_0011e8c1:
  psStack_9c0 = (secp256k1_gej *)0x11e8c6;
  secp256k1_fe_inv_var_cold_16();
  psStack_9e0 = psVar35;
LAB_0011e8c6:
  psStack_9c0 = (secp256k1_gej *)secp256k1_modinv64_update_fg_62_var;
  secp256k1_fe_inv_var_cold_9();
  iVar9 = (int)r_00;
  psVar35 = (secp256k1_gej *)psVar23;
  psVar13 = psStack_9e0;
  psStack_9e8 = psVar36;
  psStack_9d8 = psVar38;
  psStack_9d0 = psVar37;
  psStack_9c8 = psVar39;
  psStack_9c0 = (secp256k1_gej *)psVar23;
  if (iVar9 < 1) {
LAB_0011eb73:
    psStack_a18 = (secp256k1_gej *)0x11eb78;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0011eb78:
    psStack_a18 = (secp256k1_gej *)0x11eb7d;
    secp256k1_modinv64_update_fg_62_var_cold_1();
    psVar32 = psVar37;
LAB_0011eb7d:
    psStack_a18 = (secp256k1_gej *)0x11eb82;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0011eb82:
    psStack_a18 = (secp256k1_gej *)0x11eb87;
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0011eb87:
    psStack_a18 = (secp256k1_gej *)0x11eb8c;
    secp256k1_modinv64_update_fg_62_var_cold_5();
    psVar37 = psVar32;
    psVar31 = psVar39;
  }
  else {
    uStack_9f0 = (psVar16->x).n[0];
    uStack_9f8 = (psVar16->x).n[1];
    uVar3 = (psVar21->x).n[0];
    psVar25 = (secp256k1_gej *)(extraout_RDX_03->x).n[0];
    psVar37 = (secp256k1_gej *)(uVar3 * uStack_9f0);
    lVar22 = SUB168(SEXT816((long)uVar3) * SEXT816((long)uStack_9f0),8);
    uVar26 = (long)psVar25 * uStack_9f8;
    psVar36 = SUB168(SEXT816((long)psVar25) * SEXT816((long)uStack_9f8),8);
    psVar38 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar20 = (ulong)((secp256k1_gej *)~uVar26 < psVar37);
    lVar34 = (0x7fffffffffffffff - (long)psVar36) - lVar22;
    psVar13 = extraout_RDX_03;
    psVar31 = (secp256k1_gej *)~uVar26;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar36,lVar22) != SBORROW8(lVar34,uVar20)) ==
        (long)(lVar34 - uVar20) < 0 || (long)psVar36 < 0) {
      uStack_a00 = (psVar16->x).n[2];
      psVar31 = (secp256k1_gej *)(psVar16->x).n[3];
      puVar29 = (uint64_t *)((long)(psVar37->x).n + uVar26);
      psVar36 = (secp256k1_gej *)
                ((long)(psVar36->x).n + (ulong)CARRY8(uVar26,(ulong)psVar37) + lVar22);
      uVar26 = uVar3 * uStack_a00;
      psVar37 = SUB168(SEXT816((long)uVar3) * SEXT816((long)uStack_a00),8);
      auVar6 = SEXT816((long)psVar25);
      psVar25 = (secp256k1_gej *)((long)psVar25 * (long)psVar31);
      lVar22 = SUB168(auVar6 * SEXT816((long)psVar31),8);
      uVar20 = (ulong)(-(long)psVar25 - 1U < uVar26);
      lVar34 = (0x7fffffffffffffff - lVar22) - (long)psVar37;
      bVar14 = (SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar37) != SBORROW8(lVar34,uVar20)) !=
               (long)(lVar34 - uVar20) < 0 && -1 < lVar22;
      psVar16 = (secp256k1_gej *)CONCAT71((int7)(-(long)psVar25 - 1U >> 8),bVar14);
      psStack_a08 = psVar31;
      if (bVar14) goto LAB_0011eb91;
      bVar14 = CARRY8((ulong)psVar25,uVar26);
      psVar25 = (secp256k1_gej *)((long)(psVar25->x).n + uVar26);
      lVar34 = (long)(psVar37->x).n + (ulong)bVar14 + lVar22;
      psVar39 = psVar31;
      if (((ulong)puVar29 & 0x3fffffffffffffff) != 0) goto LAB_0011eb78;
      psVar32 = psVar37;
      if (((ulong)psVar25 & 0x3fffffffffffffff) != 0) goto LAB_0011eb7d;
      psVar25 = (secp256k1_gej *)((ulong)psVar25 >> 0x3e | lVar34 * 4);
      uVar20 = (ulong)puVar29 >> 0x3e | (long)psVar36 * 4;
      psVar32 = (secp256k1_gej *)(lVar34 >> 0x3e);
      psVar36 = (secp256k1_gej *)((long)psVar36 >> 0x3e);
      iStack_a0c = iVar9;
      if (iVar9 != 1) {
        psVar35 = (secp256k1_gej *)0x3fffffffffffffff;
        r_00 = (secp256k1_gej *)((ulong)r_00 & 0xffffffff);
        psVar16 = (secp256k1_gej *)0x1;
        do {
          psVar37 = (secp256k1_gej *)(psVar21->x).n[(long)psVar16];
          psVar39 = (secp256k1_gej *)((long)psVar37 * uStack_9f0 + uVar20);
          puVar12 = (undefined1 *)
                    ((long)(psVar36->x).n +
                    (ulong)CARRY8((long)psVar37 * uStack_9f0,uVar20) +
                    SUB168(SEXT816((long)psVar37) * SEXT816((long)uStack_9f0),8));
          uVar3 = (extraout_RDX_03->x).n[(long)psVar16];
          uVar20 = uVar3 * uStack_9f8;
          lVar34 = SUB168(SEXT816((long)uVar3) * SEXT816((long)uStack_9f8),8);
          if (lVar34 < 0) {
            psVar38 = (secp256k1_gej *)((-0x8000000000000000 - lVar34) - (ulong)(uVar20 != 0));
            psVar36 = (secp256k1_gej *)
                      (((long)puVar12 - (long)psVar38) - (ulong)(psVar39 < (secp256k1_gej *)-uVar20)
                      );
            if ((SBORROW8((long)puVar12,(long)psVar38) !=
                SBORROW8((long)puVar12 - (long)psVar38,(ulong)(psVar39 < (secp256k1_gej *)-uVar20)))
                == (long)psVar36 < 0) goto LAB_0011ea62;
LAB_0011eb69:
            psStack_a18 = (secp256k1_gej *)0x11eb6e;
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0011eb6e:
            psStack_a18 = (secp256k1_gej *)0x11eb73;
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0011eb73;
          }
          psVar36 = (secp256k1_gej *)(-1 - uVar20);
          lVar22 = (0x7fffffffffffffff - lVar34) - (long)puVar12;
          psVar38 = (secp256k1_gej *)(lVar22 - (ulong)(psVar36 < psVar39));
          if ((SBORROW8(0x7fffffffffffffff - lVar34,(long)puVar12) !=
              SBORROW8(lVar22,(ulong)(psVar36 < psVar39))) != (long)psVar38 < 0) goto LAB_0011eb69;
LAB_0011ea62:
          bVar14 = CARRY8((ulong)psVar39,uVar20);
          psVar39 = (secp256k1_gej *)((long)(psVar39->x).n + uVar20);
          psVar36 = (secp256k1_gej *)((long)(psVar25->x).n + (long)psVar37 * uStack_a00);
          psVar37 = (secp256k1_gej *)
                    ((long)(psVar32->x).n +
                    (ulong)CARRY8((long)psVar37 * uStack_a00,(ulong)psVar25) +
                    SUB168(SEXT816((long)psVar37) * SEXT816((long)uStack_a00),8));
          uVar20 = uVar3 * (long)psVar31;
          lVar22 = SUB168(SEXT816((long)uVar3) * SEXT816((long)psVar31),8);
          if (lVar22 < 0) {
            lVar30 = (-0x8000000000000000 - lVar22) - (ulong)(uVar20 != 0);
            lVar5 = (long)psVar37 - lVar30;
            psVar25 = (secp256k1_gej *)(lVar5 - (ulong)(psVar36 < (secp256k1_gej *)-uVar20));
            psVar38 = (secp256k1_gej *)0x7fffffffffffffff;
            if ((SBORROW8((long)psVar37,lVar30) !=
                SBORROW8(lVar5,(ulong)(psVar36 < (secp256k1_gej *)-uVar20))) != (long)psVar25 < 0)
            goto LAB_0011eb6e;
          }
          else {
            psVar25 = (secp256k1_gej *)(-1 - uVar20);
            psVar38 = (secp256k1_gej *)0x7fffffffffffffff;
            lVar5 = (0x7fffffffffffffff - lVar22) - (long)psVar37;
            if ((SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar37) !=
                SBORROW8(lVar5,(ulong)(psVar25 < psVar36))) !=
                (long)(lVar5 - (ulong)(psVar25 < psVar36)) < 0) goto LAB_0011eb6e;
          }
          puVar29 = (uint64_t *)((long)(psVar36->x).n + uVar20);
          lVar22 = (long)(psVar37->x).n + (ulong)CARRY8((ulong)psVar36,uVar20) + lVar22;
          uVar20 = (long)(puVar12 + (ulong)bVar14 + lVar34) * 4 | (ulong)psVar39 >> 0x3e;
          (psVar21->x).n[(long)&psVar16[-1].field_0x97] =
               (uint64_t)((ulong)psVar39 & 0x3fffffffffffffff);
          psVar25 = (secp256k1_gej *)(lVar22 * 4 | (ulong)puVar29 >> 0x3e);
          (extraout_RDX_03->x).n[(long)&psVar16[-1].field_0x97] =
               (ulong)puVar29 & 0x3fffffffffffffff;
          psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + 1);
          psVar32 = (secp256k1_gej *)(lVar22 >> 0x3e);
          psVar36 = (secp256k1_gej *)((long)(puVar12 + (ulong)bVar14 + lVar34) >> 0x3e);
          psVar39 = (secp256k1_gej *)((ulong)psVar39 & 0x3fffffffffffffff);
        } while (r_00 != psVar16);
      }
      psVar38 = (secp256k1_gej *)0x7fffffffffffffff;
      if ((undefined1 *)((long)(psVar36->x).n + ((ulong)(0x7fffffffffffffff < uVar20) - 1)) !=
          (undefined1 *)0xffffffffffffffff) goto LAB_0011eb82;
      psVar16 = (secp256k1_gej *)0xffffffffffffffff;
      (psVar21->x).n[(long)iVar9 + -1] = uVar20;
      psVar32 = (secp256k1_gej *)
                ((long)(psVar32->x).n + ((ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar25) - 1)
                );
      if (psVar32 == (secp256k1_gej *)0xffffffffffffffff) {
        (extraout_RDX_03->x).n[(long)iVar9 + -1] = (uint64_t)psVar25;
        return;
      }
      goto LAB_0011eb87;
    }
  }
  psStack_a18 = (secp256k1_gej *)0x11eb91;
  secp256k1_modinv64_update_fg_62_var_cold_8();
LAB_0011eb91:
  psStack_a18 = (secp256k1_gej *)secp256k1_ecmult_multi_simple_var;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psStack_a40 = psVar36;
  psStack_a38 = psVar13;
  psStack_a30 = psVar38;
  psStack_a28 = psVar37;
  psStack_a20 = psVar31;
  psStack_a18 = psVar35;
  secp256k1_gej_set_infinity(r_00);
  secp256k1_gej_set_infinity(&sStack_11c0);
  sStack_1258.x.n[0] = (uint64_t)asStack_1128;
  sStack_1258.x.n[1] = (uint64_t)asStack_ff8;
  sStack_1258.x.n[2] = (uint64_t)&sStack_e58;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1258,r_00,1,&sStack_11c0,&secp256k1_scalar_zero,
             (secp256k1_scalar *)psVar21);
  if (psVar25 != (secp256k1_gej *)0x0) {
    psVar36 = (secp256k1_gej *)0x0;
    do {
      iVar9 = (*extraout_RDX_04)(&sStack_1274,&sStack_1060,psVar36,psVar16);
      if (iVar9 == 0) {
        return;
      }
      secp256k1_gej_set_ge(&sStack_1258,&sStack_1060);
      sStack_1270.aux = asStack_1128;
      sStack_1270.pre_a = asStack_ff8;
      sStack_1270.ps = &sStack_e58;
      psVar37 = &sStack_1258;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_1270,&sStack_11c0,1,&sStack_1258,&sStack_1274,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(r_00,r_00,&sStack_11c0,&psVar37->x);
      psVar36 = (secp256k1_gej *)((long)(psVar36->x).n + 1);
    } while (psVar25 != psVar36);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}